

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

int_type __thiscall
nlohmann::json_abi_v3_11_2::detail::input_stream_adapter::get_character(input_stream_adapter *this)

{
  istream *piVar1;
  undefined8 uVar2;
  int iVar3;
  int_type iVar4;
  _Ios_Iostate __a;
  int_type res;
  input_stream_adapter *this_local;
  
  iVar3 = std::streambuf::sbumpc();
  iVar4 = std::char_traits<char>::eof();
  if (iVar3 == iVar4) {
    piVar1 = this->is;
    uVar2 = *(undefined8 *)(*(long *)piVar1 + -0x18);
    __a = std::ios::rdstate();
    std::operator|(__a,_S_eofbit);
    std::ios::clear((int)piVar1 + (int)uVar2);
  }
  return iVar3;
}

Assistant:

std::char_traits<char>::int_type get_character()
    {
        auto res = sb->sbumpc();
        // set eof manually, as we don't use the istream interface.
        if (JSON_HEDLEY_UNLIKELY(res == std::char_traits<char>::eof()))
        {
            is->clear(is->rdstate() | std::ios::eofbit);
        }
        return res;
    }